

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<bool>::GrowNoAnnotate
          (RepeatedField<bool> *this,bool was_soo,int old_size,int new_size)

{
  uint uVar1;
  Nullable<const_char_*> pcVar2;
  Arena *arena;
  char *pcVar3;
  bool *__src;
  undefined7 in_register_00000031;
  int v2;
  long lVar4;
  ulong uVar5;
  SizedPtr SVar6;
  LogMessage local_58;
  uint local_44;
  char *local_40;
  unsigned_long local_38;
  
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    v2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  else {
    v2 = 3;
  }
  local_44 = old_size;
  pcVar2 = absl::lts_20250127::log_internal::Check_GTImpl(new_size,v2,"new_size > old_capacity");
  if (pcVar2 != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ad,pcVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  arena = GetArena(this);
  uVar1 = internal::CalculateReserveSize<bool,8>(v2,new_size);
  uVar5 = (ulong)uVar1;
  lVar4 = (long)(int)uVar1;
  local_38 = 0xfffffffffffffff7;
  local_58._0_8_ = lVar4;
  pcVar2 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                     ((unsigned_long *)&local_58,&local_38,
                      "static_cast<size_t>(new_size) <= (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) / sizeof(Element)"
                     );
  if (pcVar2 == (Nullable<const_char_*>)0x0) {
    if (arena == (Arena *)0x0) {
      local_38 = 0x7fffffff;
      local_58._0_8_ = lVar4;
      pcVar2 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_58,&local_38,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
      if (pcVar2 != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x4bc,pcVar2);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_58,
                   (char (*) [59])"Requested size is too large to fit element count into int.");
        goto LAB_0042e36a;
      }
      SVar6 = internal::AllocateAtLeast(lVar4 + 8U);
      pcVar3 = (char *)SVar6.p;
      uVar5 = SVar6.n - 8;
      if (0x7ffffffe < uVar5) {
        uVar5 = 0x7fffffff;
      }
    }
    else {
      pcVar3 = Arena::CreateArray<char>(arena,lVar4 + 8U);
    }
    uVar1 = local_44;
    *(Arena **)pcVar3 = arena;
    if (0 < (int)local_44) {
      local_40 = pcVar3 + 8;
      __src = elements(this,was_soo);
      memcpy(local_40,__src,(ulong)uVar1);
    }
    if (!was_soo) {
      InternalDeallocate<false>(this);
    }
    internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,(int)uVar5,pcVar3 + 8);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x4b6,pcVar2);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_58,(char (*) [48])"Requested size is too large to fit into size_t.");
LAB_0042e36a:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}